

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_37e72::TestRecordsNumberOfFailedTests::RunImpl
          (TestRecordsNumberOfFailedTests *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  int local_58 [2];
  TestDetails local_50;
  TestResults results;
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  UnitTest::TestResults::OnTestStart(&results,(TestDetails *)(anonymous_namespace)::details);
  UnitTest::TestResults::OnTestFailure(&results,(TestDetails *)(anonymous_namespace)::details,"");
  UnitTest::TestResults::OnTestFinish(&results,(TestDetails *)(anonymous_namespace)::details,0.0);
  UnitTest::TestResults::OnTestStart(&results,(TestDetails *)(anonymous_namespace)::details);
  UnitTest::TestResults::OnTestFailure(&results,(TestDetails *)(anonymous_namespace)::details,"");
  UnitTest::TestResults::OnTestFailure(&results,(TestDetails *)(anonymous_namespace)::details,"");
  UnitTest::TestResults::OnTestFailure(&results,(TestDetails *)(anonymous_namespace)::details,"");
  UnitTest::TestResults::OnTestFinish(&results,(TestDetails *)(anonymous_namespace)::details,0.0);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_58[1] = 2;
  local_58[0] = UnitTest::TestResults::GetFailedTestCount(&results);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_50,*ppTVar2,0x37);
  UnitTest::CheckEqual<int,int>(results_00,local_58 + 1,local_58,&local_50);
  return;
}

Assistant:

TEST(RecordsNumberOfFailedTests)
{
    TestResults results;

    results.OnTestStart(details);
    results.OnTestFailure(details, "");
    results.OnTestFinish(details, 0);

    results.OnTestStart(details);
    results.OnTestFailure(details, "");
    results.OnTestFailure(details, "");
    results.OnTestFailure(details, "");
    results.OnTestFinish(details, 0);

    CHECK_EQUAL (2, results.GetFailedTestCount());
}